

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O0

void __thiscall TasGrid::GridGlobal::loadNeededValues(GridGlobal *this,double *vals)

{
  bool bVar1;
  double *vals_local;
  GridGlobal *this_local;
  
  clearGpuValues(this);
  bVar1 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).points);
  if (!bVar1) {
    bVar1 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).needed);
    if (!bVar1) {
      StorageSet::addValues
                (&(this->super_BaseCanonicalGrid).values,&(this->super_BaseCanonicalGrid).points,
                 &(this->super_BaseCanonicalGrid).needed,vals);
      goto LAB_00229f23;
    }
  }
  StorageSet::setValues(&(this->super_BaseCanonicalGrid).values,vals);
LAB_00229f23:
  acceptUpdatedTensors(this);
  return;
}

Assistant:

void GridGlobal::loadNeededValues(const double *vals){
    clearGpuValues();
    if (points.empty() || needed.empty()){
        values.setValues(vals);
    }else{
        values.addValues(points, needed, vals);
    }
    acceptUpdatedTensors();
}